

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O0

bool IsSystem24Track(Track *track)

{
  bool bVar1;
  int iVar2;
  reference this;
  Sector *s;
  const_iterator __end1;
  const_iterator __begin1;
  Track *__range1;
  int i;
  Track *track_local;
  
  __range1._4_4_ = 0;
  iVar2 = Track::size(track);
  if (iVar2 == 7) {
    __end1 = Track::begin(track);
    s = (Sector *)Track::end(track);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>
                                       *)&s), bVar1) {
      this = __gnu_cxx::
             __normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
             operator*(&__end1);
      if ((((this->datarate != _500K) || (this->encoding != MFM)) ||
          ((this->header).size != (uint)"\x04\x04\x04\x04\x04\x03\x01"[__range1._4_4_])) ||
         (bVar1 = Sector::has_data(this), !bVar1)) {
        return false;
      }
      __gnu_cxx::__normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
      operator++(&__end1);
      __range1._4_4_ = __range1._4_4_ + 1;
    }
    if (opt.debug != 0) {
      util::operator<<((LogHelper *)&util::cout,(char (*) [26])"detected System-24 track\n");
    }
    track_local._7_1_ = true;
  }
  else {
    track_local._7_1_ = false;
  }
  return track_local._7_1_;
}

Assistant:

bool IsSystem24Track(const Track& track)
{
    static const uint8_t sizes[] = { 4,4,4,4,4,3,1 };
    auto i = 0;

    if (track.size() != arraysize(sizes))
        return false;

    for (auto& s : track)
    {
        if (s.datarate != DataRate::_500K || s.encoding != Encoding::MFM ||
            s.header.size != sizes[i++] || !s.has_data())
            return false;
    }

    if (opt.debug) util::cout << "detected System-24 track\n";
    return true;
}